

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  int *s;
  int iVar1;
  dohdata *pdVar2;
  sockaddr *psVar3;
  undefined8 uVar4;
  ushort rdlength;
  DOHcode DVar5;
  uint uVar6;
  int iVar7;
  uchar *doh;
  size_t sVar8;
  size_t sVar9;
  Curl_addrinfo *pCVar10;
  Curl_dns_entry *pCVar11;
  ushort type;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  Curl_addrinfo *pCVar18;
  ulong uVar19;
  ushort uVar20;
  byte *pbVar21;
  long lVar22;
  dynbuf *pdVar23;
  CURLcode CVar24;
  bool bVar25;
  DOHcode rc [2];
  dohentry de;
  Curl_addrinfo *local_388;
  uint local_35c;
  DOHcode local_348;
  undefined8 local_340;
  Curl_dns_entry **local_338;
  size_t local_330;
  uint local_328 [2];
  char local_31e [126];
  undefined1 local_2a0 [132];
  byte local_21c [476];
  int local_40;
  uint local_3c;
  int local_38;
  
  pdVar2 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar2 == (dohdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((pdVar2->probe[0].easy == (CURL_conflict *)0x0) &&
     (pdVar2->probe[1].easy == (CURL_conflict *)0x0)) {
    Curl_failf(data,"Could not DoH-resolve: %s",(data->state).async.hostname);
    return (((uint)data->conn->bits & 0x20) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  if (pdVar2->pending != 0) {
    return CURLE_OK;
  }
  local_340 = 0;
  lVar17 = 8;
  local_338 = dnsp;
  do {
    curl_multi_remove_handle
              (data->multi,*(Curl_easy **)(pdVar2->probe[0].dohbuffer + lVar17 + -0x14));
    Curl_close((Curl_easy **)(pdVar2->probe[0].dohbuffer + lVar17 + -0x14));
    lVar17 = lVar17 + 0x238;
  } while (lVar17 == 0x240);
  lVar17 = 0;
  memset(local_2a0,0,0x270);
  local_3c = 0x7fffffff;
  do {
    Curl_dyn_init((dynbuf *)(local_2a0 + lVar17),0x100);
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0x80);
  lVar17 = 0;
LAB_00158a18:
  local_388 = (Curl_addrinfo *)(lVar17 * 0x238);
  if (pdVar2->probe[lVar17].dnstype != 0) {
    local_388 = (Curl_addrinfo *)(pdVar2->probe + lVar17);
    s = &local_388[0xb].ai_socktype;
    doh = Curl_dyn_uptr((dynbuf *)s);
    sVar8 = Curl_dyn_len((dynbuf *)s);
    uVar12 = local_388->ai_socktype;
    local_328[0] = 0xc;
    DVar5 = DOH_TOO_SMALL_BUFFER;
    if ((((0xb < sVar8) && (DVar5 = DOH_DNS_BAD_ID, doh != (uchar *)0x0)) && (*doh == '\0')) &&
       ((doh[1] == '\0' && (DVar5 = DOH_DNS_BAD_RCODE, (doh[3] & 0xf) == 0)))) {
      for (uVar20 = *(ushort *)(doh + 4) << 8 | *(ushort *)(doh + 4) >> 8; uVar20 != 0;
          uVar20 = uVar20 - 1) {
        DVar5 = skipqname(doh,sVar8,local_328);
        if (DVar5 != DOH_OK) goto LAB_00158d87;
        if (sVar8 < local_328[0] + 4) {
          DVar5 = DOH_DNS_OUT_OF_RANGE;
          goto LAB_00158d87;
        }
        local_328[0] = local_328[0] + 4;
      }
      uVar20 = *(ushort *)(doh + 6) << 8 | *(ushort *)(doh + 6) >> 8;
      type = 0;
      do {
        if (uVar20 == 0) {
          uVar20 = *(ushort *)(doh + 8) << 8 | *(ushort *)(doh + 8) >> 8;
          goto joined_r0x00158c51;
        }
        DVar5 = skipqname(doh,sVar8,local_328);
        if (DVar5 == DOH_OK) {
          uVar6 = local_328[0] + 2;
          DVar5 = DOH_DNS_OUT_OF_RANGE;
          uVar15 = local_328[0];
          if (uVar6 <= sVar8) {
            type = *(ushort *)(doh + (int)local_328[0]) << 8 |
                   *(ushort *)(doh + (int)local_328[0]) >> 8;
            if (((type == 5) || (type == 0x27)) || (uVar12 == type)) {
              uVar14 = local_328[0] + 4;
              uVar15 = uVar6;
              if (uVar14 <= sVar8) {
                if ((ushort)(*(ushort *)(doh + (int)uVar6) << 8 | *(ushort *)(doh + (int)uVar6) >> 8
                            ) == 1) {
                  uVar6 = local_328[0] + 8;
                  uVar15 = uVar14;
                  if (uVar6 <= sVar8) {
                    uVar15 = *(uint *)(doh + (int)uVar14);
                    uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                             uVar15 << 0x18;
                    if (uVar15 < local_3c) {
                      local_3c = uVar15;
                    }
                    local_328[0] = local_328[0] + 10;
                    uVar15 = uVar6;
                    if (local_328[0] <= sVar8) {
                      rdlength = *(ushort *)(doh + (int)uVar6) << 8 |
                                 *(ushort *)(doh + (int)uVar6) >> 8;
                      uVar15 = local_328[0] + rdlength;
                      if (sVar8 < uVar15) {
                        bVar25 = false;
                      }
                      else {
                        DVar5 = rdata(doh,sVar8,rdlength,type,local_328[0],(dohentry *)local_2a0);
                        bVar25 = DVar5 == DOH_OK;
                        if (bVar25) {
                          uVar20 = uVar20 - 1;
                          DVar5 = local_348;
                          local_328[0] = uVar15;
                        }
                      }
                      goto LAB_00158bfb;
                    }
                  }
                }
                else {
                  DVar5 = DOH_DNS_UNEXPECTED_CLASS;
                }
              }
            }
            else {
              DVar5 = DOH_DNS_UNEXPECTED_TYPE;
            }
          }
          local_328[0] = uVar15;
          bVar25 = false;
        }
        else {
          bVar25 = false;
        }
LAB_00158bfb:
        local_348 = DVar5;
      } while (bVar25);
    }
    goto LAB_00158d87;
  }
  goto LAB_00158dfe;
joined_r0x00158c51:
  if (uVar20 == 0) goto LAB_00158cc4;
  DVar5 = skipqname(doh,sVar8,local_328);
  if (DVar5 != DOH_OK) goto LAB_00158d87;
  uVar12 = local_328[0] + 8;
  DVar5 = DOH_DNS_OUT_OF_RANGE;
  if (((sVar8 < uVar12) || (uVar15 = local_328[0] + 10, local_328[0] = uVar12, sVar8 < uVar15)) ||
     (uVar12 = (ushort)(*(ushort *)(doh + (int)uVar12) << 8 | *(ushort *)(doh + (int)uVar12) >> 8) +
               uVar15, local_328[0] = uVar15, sVar8 < uVar12)) goto LAB_00158d87;
  uVar20 = uVar20 - 1;
  local_328[0] = uVar12;
  goto joined_r0x00158c51;
LAB_00158cc4:
  for (uVar20 = *(ushort *)(doh + 10) << 8 | *(ushort *)(doh + 10) >> 8; uVar20 != 0;
      uVar20 = uVar20 - 1) {
    DVar5 = skipqname(doh,sVar8,local_328);
    if (DVar5 != DOH_OK) goto LAB_00158d87;
    uVar12 = local_328[0] + 8;
    DVar5 = DOH_DNS_OUT_OF_RANGE;
    if (((sVar8 < uVar12) || (uVar15 = local_328[0] + 10, local_328[0] = uVar12, sVar8 < uVar15)) ||
       (uVar12 = (ushort)(*(ushort *)(doh + (int)uVar12) << 8 | *(ushort *)(doh + (int)uVar12) >> 8)
                 + uVar15, local_328[0] = uVar15, sVar8 < uVar12)) goto LAB_00158d87;
    local_328[0] = uVar12;
  }
  DVar5 = DOH_DNS_MALFORMAT;
  if (sVar8 == local_328[0]) {
    DVar5 = DOH_OK;
    if (local_40 == 0 && local_38 == 0) {
      DVar5 = DOH_NO_CONTENT;
    }
    if (type == 2) {
      DVar5 = DOH_OK;
    }
  }
LAB_00158d87:
  *(DOHcode *)((long)&local_340 + lVar17 * 4) = DVar5;
  Curl_dyn_free((dynbuf *)s);
  if (((data != (Curl_easy *)0x0) && (DVar5 != DOH_OK)) && (((data->set).field_0x8bd & 0x10) != 0))
  {
    pcVar16 = "bad error code";
    if (DVar5 < (DOH_DNS_BAD_ID|DOH_DNS_OUT_OF_RANGE)) {
      pcVar16 = errors_rel + *(int *)(errors_rel + (ulong)DVar5 * 4);
    }
    pcVar13 = "AAAA";
    if (local_388->ai_socktype == 1) {
      pcVar13 = "A";
    }
    Curl_infof(data,"DoH: %s type %s for %s",pcVar16,pcVar13,pdVar2->host);
  }
LAB_00158dfe:
  bVar25 = lVar17 != 0;
  lVar17 = lVar17 + 1;
  if (bVar25) goto LAB_00158e23;
  goto LAB_00158a18;
LAB_00158e23:
  if ((int)local_340 != 0) {
    pCVar18 = (Curl_addrinfo *)0x6;
    local_388 = pCVar18;
    if (local_340._4_4_ != 0) goto LAB_001592d8;
  }
  if (data != (Curl_easy *)0x0) {
    if (((data->set).field_0x8bd & 0x10) != 0) {
      Curl_infof(data,"DoH Host name: %s",pdVar2->host);
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"TTL: %u seconds",(ulong)local_3c);
    }
  }
  if (0 < local_40) {
    pbVar21 = local_21c + 1;
    lVar17 = 0;
    do {
      if (*(int *)(local_21c + lVar17 * 0x14 + -4) == 0x1c) {
        curl_msnprintf((char *)local_328,0x80,"DoH AAAA: ");
        sVar8 = 0x76;
        uVar19 = 0xfffffffffffffffe;
        pcVar16 = local_31e;
        do {
          pcVar13 = ":";
          if (uVar19 == 0xfffffffffffffffe) {
            pcVar13 = "";
          }
          curl_msnprintf(pcVar16,sVar8,"%s%02x%02x",pcVar13,(ulong)pbVar21[uVar19 + 1],
                         (ulong)pbVar21[uVar19 + 2]);
          sVar9 = strlen(pcVar16);
          sVar8 = sVar8 - sVar9;
          pcVar16 = pcVar16 + sVar9;
          uVar19 = uVar19 + 2;
        } while (uVar19 < 0xe);
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"%s",local_328);
        }
      }
      else if (((*(int *)(local_21c + lVar17 * 0x14 + -4) == 1) && (data != (Curl_easy *)0x0)) &&
              (((data->set).field_0x8bd & 0x10) != 0)) {
        lVar22 = lVar17 * 0x14;
        Curl_infof(data,"DoH A: %u.%u.%u.%u",(ulong)local_21c[lVar22],(ulong)local_21c[lVar22 + 1],
                   (ulong)local_21c[lVar22 + 2],(ulong)local_21c[lVar22 + 3]);
      }
      local_388 = (Curl_addrinfo *)(local_2a0 + 0x80);
      lVar17 = lVar17 + 1;
      pbVar21 = pbVar21 + 0x14;
    } while (lVar17 < local_40);
  }
  if (0 < local_38) {
    pdVar23 = (dynbuf *)local_2a0;
    local_388 = (Curl_addrinfo *)0x0;
    do {
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        pcVar16 = Curl_dyn_ptr(pdVar23);
        Curl_infof(data,"CNAME: %s",pcVar16);
      }
      local_388 = (Curl_addrinfo *)((long)&local_388->ai_flags + 1);
      pdVar23 = pdVar23 + 1;
    } while ((long)local_388 < (long)local_38);
  }
  pcVar16 = pdVar2->host;
  iVar1 = pdVar2->port;
  sVar9 = strlen(pcVar16);
  if (local_40 == 0) {
    pCVar18 = (Curl_addrinfo *)0x6;
  }
  else {
    if (local_40 < 1) {
      local_388 = (Curl_addrinfo *)0x0;
      local_35c = 0;
    }
    else {
      local_330 = sVar9 + 1;
      uVar20 = (ushort)iVar1;
      lVar17 = 0;
      pbVar21 = local_21c;
      local_35c = 0;
      pCVar18 = (Curl_addrinfo *)0x0;
      local_388 = (Curl_addrinfo *)0x0;
      do {
        iVar1 = *(int *)(pbVar21 + -4);
        lVar22 = 0x1c;
        if (iVar1 != 0x1c) {
          lVar22 = 0x10;
        }
        pCVar10 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar9 + 0x31 + lVar22);
        if (pCVar10 == (Curl_addrinfo *)0x0) {
          local_35c = 0x1b;
        }
        else {
          pCVar10->ai_addr = (sockaddr *)(pCVar10 + 1);
          pcVar13 = (char *)((long)&pCVar10[1].ai_flags + lVar22);
          pCVar10->ai_canonname = pcVar13;
          memcpy(pcVar13,pcVar16,local_330);
          if (local_388 == (Curl_addrinfo *)0x0) {
            local_388 = pCVar10;
          }
          if (pCVar18 != (Curl_addrinfo *)0x0) {
            pCVar18->ai_next = pCVar10;
          }
          iVar7 = (uint)(iVar1 == 0x1c) * 8 + 2;
          pCVar10->ai_family = iVar7;
          pCVar10->ai_socktype = 1;
          pCVar10->ai_addrlen = (curl_socklen_t)lVar22;
          psVar3 = pCVar10->ai_addr;
          if (iVar1 == 0x1c) {
            uVar4 = *(undefined8 *)(pbVar21 + 8);
            *(undefined8 *)(psVar3->sa_data + 6) = *(undefined8 *)pbVar21;
            psVar3[1].sa_family = (short)uVar4;
            psVar3[1].sa_data[0] = (char)((ulong)uVar4 >> 0x10);
            psVar3[1].sa_data[1] = (char)((ulong)uVar4 >> 0x18);
            psVar3[1].sa_data[2] = (char)((ulong)uVar4 >> 0x20);
            psVar3[1].sa_data[3] = (char)((ulong)uVar4 >> 0x28);
            psVar3[1].sa_data[4] = (char)((ulong)uVar4 >> 0x30);
            psVar3[1].sa_data[5] = (char)((ulong)uVar4 >> 0x38);
          }
          else {
            *(undefined4 *)(psVar3->sa_data + 2) = *(undefined4 *)pbVar21;
          }
          psVar3->sa_family = (sa_family_t)iVar7;
          *(ushort *)psVar3->sa_data = uVar20 << 8 | uVar20 >> 8;
          pCVar18 = pCVar10;
        }
        if (pCVar10 == (Curl_addrinfo *)0x0) break;
        lVar17 = lVar17 + 1;
        pbVar21 = pbVar21 + 0x14;
      } while (lVar17 < local_40);
    }
    pCVar18 = (Curl_addrinfo *)(ulong)local_35c;
    if (local_35c != 0) {
      Curl_freeaddrinfo(local_388);
      local_388 = (Curl_addrinfo *)0x0;
    }
  }
  CVar24 = (CURLcode)pCVar18;
  if (CVar24 == CURLE_OK) {
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    pCVar11 = Curl_cache_addr(data,local_388,pdVar2->host,0,pdVar2->port);
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
    if (pCVar11 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo(local_388);
    }
    else {
      (data->state).async.dns = pCVar11;
      *local_338 = pCVar11;
    }
    pCVar18 = (Curl_addrinfo *)0x0;
  }
  else if (0 < local_38) {
    lVar17 = 0;
    pdVar23 = (dynbuf *)local_2a0;
    do {
      Curl_dyn_free(pdVar23);
      lVar17 = lVar17 + 1;
      pdVar23 = pdVar23 + 1;
    } while (lVar17 < local_38);
  }
  if (CVar24 != CURLE_OK) {
    return CVar24;
  }
LAB_001592d8:
  if (0 < local_38) {
    pdVar23 = (dynbuf *)local_2a0;
    lVar17 = 0;
    do {
      Curl_dyn_free(pdVar23);
      lVar17 = lVar17 + 1;
      pdVar23 = pdVar23 + 1;
    } while (lVar17 < local_38);
  }
  (*Curl_cfree)((data->req).doh);
  (data->req).doh = (dohdata *)0x0;
  return (CURLcode)pCVar18;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct dohdata *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(!dohp->probe[DOH_PROBE_SLOT_IPADDR_V4].easy &&
     !dohp->probe[DOH_PROBE_SLOT_IPADDR_V6].easy) {
    failf(data, "Could not DoH-resolve: %s", data->state.async.hostname);
    return CONN_IS_PROXIED(data->conn)?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_PROBE_SLOTS] = {
      DOH_OK, DOH_OK
    };
    struct dohentry de;
    int slot;
    /* remove DoH handles from multi handle and close them */
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
      Curl_close(&dohp->probe[slot].easy);
    }
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      struct dnsprobe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_decode(Curl_dyn_uptr(&p->serverdoh),
                            Curl_dyn_len(&p->serverdoh),
                            p->dnstype,
                            &de);
      Curl_dyn_free(&p->serverdoh);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_PROBE_SLOT_IPADDR_V4] || !rc[DOH_PROBE_SLOT_IPADDR_V6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DoH Host name: %s", dohp->host);
      showdoh(data, &de);

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, 0, dohp->port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */

    /* All done */
    de_cleanup(&de);
    Curl_safefree(data->req.doh);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}